

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

char * GetDirectoryPath(char *filePath)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  char *__dest;
  
  __dest = GetDirectoryPath::dirPath;
  pcVar1 = (char *)0x0;
  memset(GetDirectoryPath::dirPath,0,0x1000);
  if (((filePath[1] != ':') && (*filePath != '/')) && (*filePath != '\\')) {
    GetDirectoryPath::dirPath[0] = '.';
    GetDirectoryPath::dirPath[1] = '/';
  }
  pcVar1 = strprbrk(filePath,pcVar1);
  if (pcVar1 != (char *)0x0) {
    if (pcVar1 == filePath) {
      GetDirectoryPath::dirPath[0] = *filePath;
      pcVar1 = GetDirectoryPath::dirPath + 1;
    }
    else {
      if (filePath[1] != ':') {
        __dest = GetDirectoryPath::dirPath + 2;
        if (*filePath == '/') {
          __dest = GetDirectoryPath::dirPath;
        }
        if (*filePath == '\\') {
          __dest = GetDirectoryPath::dirPath;
        }
      }
      sVar2 = strlen(filePath);
      sVar3 = strlen(pcVar1);
      memcpy(__dest,filePath,(sVar2 - sVar3) + 1);
      sVar2 = strlen(filePath);
      sVar3 = strlen(pcVar1);
      if ((filePath[1] == ':') || (*filePath == '\\')) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)((uint)(*filePath != '/') * 2);
      }
      pcVar1 = GetDirectoryPath::dirPath + (sVar2 - sVar3) + uVar4;
    }
    *pcVar1 = '\0';
  }
  return GetDirectoryPath::dirPath;
}

Assistant:

const char *GetDirectoryPath(const char *filePath)
{
    /*
    // NOTE: Directory separator is different in Windows and other platforms,
    // fortunately, Windows also support the '/' separator, that's the one should be used
    #if defined(_WIN32)
        char separator = '\\';
    #else
        char separator = '/';
    #endif
    */
    const char *lastSlash = NULL;
    static char dirPath[MAX_FILEPATH_LENGTH] = { 0 };
    memset(dirPath, 0, MAX_FILEPATH_LENGTH);

    // In case provided path does not contain a root drive letter (C:\, D:\) nor leading path separator (\, /),
    // we add the current directory path to dirPath
    if (filePath[1] != ':' && filePath[0] != '\\' && filePath[0] != '/')
    {
        // For security, we set starting path to current directory,
        // obtained path will be concatenated to this
        dirPath[0] = '.';
        dirPath[1] = '/';
    }

    lastSlash = strprbrk(filePath, "\\/");
    if (lastSlash)
    {
        if (lastSlash == filePath)
        {
            // The last and only slash is the leading one: path is in a root directory
            dirPath[0] = filePath[0];
            dirPath[1] = '\0';
        }
        else
        {
            // NOTE: Be careful, strncpy() is not safe, it does not care about '\0'
            char *dirPathPtr = dirPath;
            if ((filePath[1] != ':') && (filePath[0] != '\\') && (filePath[0] != '/')) dirPathPtr += 2;     // Skip drive letter, "C:"
            memcpy(dirPathPtr, filePath, strlen(filePath) - (strlen(lastSlash) - 1));
            dirPath[strlen(filePath) - strlen(lastSlash) + (((filePath[1] != ':') && (filePath[0] != '\\') && (filePath[0] != '/'))? 2 : 0)] = '\0';  // Add '\0' manually
        }
    }

    return dirPath;
}